

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite.c
# Opt level: O0

_Bool has_test(TestSuite *suite,char *name)

{
  _Bool _Var1;
  int iVar2;
  TestSuite *in_RSI;
  long in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  
  iVar3 = 0;
  do {
    if (*(int *)(in_RDI + 0x30) <= iVar3) {
      return false;
    }
    if (*(int *)(*(long *)(in_RDI + 0x18) + (long)iVar3 * 0x18) == 0) {
      iVar2 = strcmp(*(char **)(*(long *)(in_RDI + 0x18) + (long)iVar3 * 0x18 + 8),(char *)in_RSI);
      if (iVar2 == 0) {
        return true;
      }
    }
    else {
      _Var1 = has_test(in_RSI,(char *)CONCAT44(iVar3,in_stack_ffffffffffffffe0));
      if (_Var1) {
        return true;
      }
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

bool has_test(TestSuite *suite, const char *name) {
	int i;
	for (i = 0; i < suite->size; i++) {
        if (suite->tests[i].type == test_function) {
            if (strcmp(suite->tests[i].name, name) == 0) {
                return true;
            }
        } else if (has_test(suite->tests[i].Runnable.suite, name)) {
            return true;
        }
	}

	return false;
}